

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O1

int lws_clean_url(char *p)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  
  pcVar4 = p;
  if ((((*p == 'h') && (p[1] == 't')) && (p[2] == 't')) && (p[3] == 'p')) {
    pcVar2 = p + 4;
    if (p[4] == 's') {
      pcVar2 = p + 5;
    }
    pcVar4 = pcVar2;
    if (p[(ulong)(p[4] == 's') + 4] == ':') {
      pcVar4 = pcVar2 + 1;
      if (pcVar2[1] == '/') {
        pcVar4 = pcVar2 + 2;
      }
    }
  }
  pcVar2 = pcVar4 + 1;
LAB_0011c04e:
  do {
    if (*pcVar4 == '/') {
      if (pcVar4[1] == '/') {
        cVar1 = *pcVar4;
        pcVar3 = pcVar2;
        while (cVar1 != '\0') {
          cVar1 = *pcVar3;
          pcVar3[-1] = cVar1;
          pcVar3 = pcVar3 + 1;
        }
        goto LAB_0011c04e;
      }
    }
    else if (*pcVar4 == '\0') {
      return 0;
    }
    pcVar4 = pcVar4 + 1;
    pcVar2 = pcVar2 + 1;
  } while( true );
}

Assistant:

int lws_clean_url(char *p)
{
	if (p[0] == 'h' && p[1] == 't' && p[2] == 't' && p[3] == 'p') {
		p += 4;
		if (*p == 's')
		p++;
		if (*p == ':') {
			p++;
			if (*p == '/')
			p++;
		}
	}

	while (*p) {
		if (p[0] == '/' && p[1] == '/') {
			char *p1 = p;
			while (*p1) {
				*p1 = p1[1];
				p1++;
			}
			continue;
		}
		p++;
	}

	return 0;
}